

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loggingTest2.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  LogTest2 *pLVar1;
  LogTest2 *local_78;
  TestCase *test_set [10];
  TestRunner local_19;
  char **ppcStack_18;
  TestRunner runner;
  char **argv_local;
  int argc_local;
  
  ppcStack_18 = argv;
  TestRunner::TestRunner(&local_19,*argv);
  pLVar1 = (LogTest2 *)
           operator_new(0x128,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/loggingTest2.cpp"
                        ,0xa3);
  LogTest2::LogTest2(pLVar1,1);
  local_78 = pLVar1;
  pLVar1 = (LogTest2 *)
           operator_new(0x128,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/loggingTest2.cpp"
                        ,0xa4);
  LogTest2::LogTest2(pLVar1,2);
  test_set[0] = (TestCase *)pLVar1;
  pLVar1 = (LogTest2 *)
           operator_new(0x128,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/loggingTest2.cpp"
                        ,0xa5);
  LogTest2::LogTest2(pLVar1,3);
  test_set[1] = (TestCase *)pLVar1;
  TestRunner::RunAll(&local_19,(TestCase **)&local_78,3);
  return 0;
}

Assistant:

int main( int argc, char* argv[] )
{
	TestRunner runner( argv[ 0 ] );
	TestCase* test_set[ 10 ];

	test_set[ 0 ] = jh_new LogTest2( 1 );
	test_set[ 1 ] = jh_new LogTest2( 2 );
	test_set[ 2 ] = jh_new LogTest2( 3 );

	runner.RunAll( test_set, 3 );
	
	
	return 0;



}